

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1556.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  CURLcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  headerinfo info;
  int res;
  CURL *curl;
  CURLcode code;
  char *URL_local;
  
  info.largest._4_4_ = 0;
  memset(&ec_1,0,8);
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1556.c"
                  ,0x34,iVar2,uVar3);
    info.largest._4_4_ = iVar2;
  }
  if (info.largest._4_4_ == 0) {
    lVar4 = curl_easy_init();
    if (lVar4 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1556.c"
                    ,0x36);
      info.largest._4_4_ = 0x7c;
    }
    if (info.largest._4_4_ == 0) {
      iVar2 = curl_easy_setopt(lVar4,0x4e6f,header);
      uVar1 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_easy_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1556.c"
                      ,0x38,iVar2,uVar3);
        info.largest._4_4_ = iVar2;
      }
      if (info.largest._4_4_ == 0) {
        iVar2 = curl_easy_setopt(lVar4,0x272d,&ec_1);
        uVar1 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_easy_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1556.c"
                        ,0x39,iVar2,uVar3);
          info.largest._4_4_ = iVar2;
        }
        if (info.largest._4_4_ == 0) {
          iVar2 = curl_easy_setopt(lVar4,0x29,1);
          uVar1 = _stderr;
          if (iVar2 != 0) {
            uVar3 = curl_easy_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1556.c"
                          ,0x3a,iVar2,uVar3);
            info.largest._4_4_ = iVar2;
          }
          if (info.largest._4_4_ == 0) {
            iVar2 = curl_easy_setopt(lVar4,0x2712,URL);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar3 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1556.c"
                            ,0x3b,iVar2,uVar3);
              info.largest._4_4_ = iVar2;
            }
            if (info.largest._4_4_ == 0) {
              iVar2 = curl_easy_perform(lVar4);
              uVar1 = _stderr;
              if (iVar2 == 0) {
                curl_mprintf("Max: %ld\n",_ec_1);
              }
              else {
                uVar3 = curl_easy_strerror(iVar2);
                curl_mfprintf(uVar1,"%s:%d curl_easy_perform() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib1556.c"
                              ,0x41,iVar2,uVar3);
                info.largest._4_4_ = 0x7e;
              }
            }
          }
        }
      }
    }
    curl_easy_cleanup(lVar4);
    curl_global_cleanup();
    URL_local._4_4_ = info.largest._4_4_;
  }
  else {
    URL_local._4_4_ = info.largest._4_4_;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURLcode code;
  CURL *curl = NULL;
  int res = 0;
  struct headerinfo info = {0};

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_HEADERFUNCTION, header);
  easy_setopt(curl, CURLOPT_HEADERDATA, &info);
  easy_setopt(curl, CURLOPT_VERBOSE, 1L);
  easy_setopt(curl, CURLOPT_URL, URL);

  code = curl_easy_perform(curl);
  if(CURLE_OK != code) {
    fprintf(stderr, "%s:%d curl_easy_perform() failed, "
            "with code %d (%s)\n",
            __FILE__, __LINE__, (int)code, curl_easy_strerror(code));
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }

  printf("Max: %ld\n", (long)info.largest);

test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}